

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

BOOL VirtualProtect(LPVOID lpAddress,SIZE_T dwSize,DWORD flNewProtect,PDWORD lpflOldProtect)

{
  BYTE *pBVar1;
  byte bVar2;
  INT __prot;
  int iVar3;
  DWORD DVar4;
  CPalThread *pThread;
  PCMI p_Var5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  BOOL BVar9;
  void *__addr;
  ulong local_38;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0033745a;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  if ((flNewProtect & 0xffffff88) == 0) {
    if (lpflOldProtect == (PDWORD)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033745a;
      SetLastError(0x3e6);
      BVar9 = 0;
    }
    else {
      __addr = (void *)((ulong)lpAddress & 0xfffffffffffff000);
      uVar8 = dwSize + 0xfff + ((ulong)lpAddress & 0xfff);
      p_Var5 = VIRTUALFindRegionInformation((UINT_PTR)__addr);
      if (p_Var5 == (PCMI)0x0) {
        __n = 0;
        local_38 = 0;
      }
      else {
        if (PAL_InitializeChakraCoreCalled != true) goto LAB_0033745a;
        local_38 = (long)__addr - p_Var5->startBoundary >> 0xc;
        __n = uVar8 >> 0xc;
        if (local_38 < __n) {
          uVar7 = local_38;
          do {
            if ((p_Var5->pAllocState[uVar7 >> 3] >> ((uint)uVar7 & 7) & 1) == 0) {
              SetLastError(0x1e7);
              goto LAB_00337292;
            }
            uVar7 = uVar7 + 1;
          } while (__n != uVar7);
        }
      }
      __prot = W32toUnixAccessControl(flNewProtect);
      iVar3 = mprotect(__addr,uVar8 & 0xfffffffffffff000,__prot);
      if (iVar3 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033745a;
        if (p_Var5 == (PCMI)0x0) {
          *lpflOldProtect = 0x40;
        }
        else {
          DVar4 = VIRTUALConvertVirtualFlags(p_Var5->pProtectionState[local_38]);
          *lpflOldProtect = DVar4;
          pBVar1 = p_Var5->pProtectionState;
          bVar2 = VIRTUALConvertWinFlags(flNewProtect);
          memset(pBVar1 + local_38,(uint)bVar2,__n);
        }
        BVar9 = 1;
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033745a;
        piVar6 = __errno_location();
        strerror(*piVar6);
        if (*piVar6 == 0xd) {
          DVar4 = 0xc;
        }
        else {
          BVar9 = 0;
          if (*piVar6 != 0x16) goto LAB_00337299;
          DVar4 = 0x1e7;
        }
        SetLastError(DVar4);
        BVar9 = 0;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","VirtualProtect",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x8db);
    fprintf(_stderr,
            "flProtect can be one of PAGE_NOACCESS, PAGE_READONLY, PAGE_READWRITE, PAGE_EXECUTE, PAGE_EXECUTE_READ , or PAGE_EXECUTE_READWRITE. \n"
           );
    SetLastError(0x57);
LAB_00337292:
    BVar9 = 0;
  }
LAB_00337299:
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar9;
  }
LAB_0033745a:
  abort();
}

Assistant:

BOOL
PALAPI
VirtualProtect(
           IN LPVOID lpAddress,
           IN SIZE_T dwSize,
           IN DWORD flNewProtect,
           OUT PDWORD lpflOldProtect)
{
    BOOL     bRetVal = FALSE;
    PCMI     pEntry = NULL;
    SIZE_T   MemSize = 0;
    UINT_PTR StartBoundary = 0;
    SIZE_T   Index = 0;
    SIZE_T   NumberOfPagesToChange = 0;
    SIZE_T   OffSet = 0;
    CPalThread * pthrCurrent;

    PERF_ENTRY(VirtualProtect);
    ENTRY("VirtualProtect(lpAddress=%p, dwSize=%u, flNewProtect=%#x, "
          "flOldProtect=%p)\n",
          lpAddress, dwSize, flNewProtect, lpflOldProtect);

    pthrCurrent = InternalGetCurrentThread();
    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;
    MemSize = (((UINT_PTR)(dwSize) + ((UINT_PTR)(lpAddress) & VIRTUAL_PAGE_MASK)
                + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK);

#if DEBUG
    if ( VIRTUALContainsInvalidProtectionFlags( flNewProtect ) )
    {
        ASSERT( "flProtect can be one of PAGE_NOACCESS, PAGE_READONLY, "
               "PAGE_READWRITE, PAGE_EXECUTE, PAGE_EXECUTE_READ "
               ", or PAGE_EXECUTE_READWRITE. \n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto ExitVirtualProtect;
    }

    if ( !lpflOldProtect)
    {
        ERROR( "lpflOldProtect was invalid.\n" );
        SetLastError( ERROR_NOACCESS );
        goto ExitVirtualProtect;
    }
#endif

    pEntry = VIRTUALFindRegionInformation( StartBoundary );
    if ( NULL != pEntry )
    {
        /* See if the pages are committed. */
        Index = OffSet = StartBoundary - pEntry->startBoundary == 0 ?
             0 : ( StartBoundary - pEntry->startBoundary ) / VIRTUAL_PAGE_SIZE;
        NumberOfPagesToChange = MemSize / VIRTUAL_PAGE_SIZE;

        TRACE( "Number of pages to check %d, starting page %d \n",
               NumberOfPagesToChange, Index );

        for ( ; Index < NumberOfPagesToChange; Index++  )
        {
            if ( !VIRTUALIsPageCommitted( Index, pEntry ) )
            {
                ERROR( "You can only change the protection attributes"
                       " on committed memory.\n" );
                SetLastError( ERROR_INVALID_ADDRESS );
                goto ExitVirtualProtect;
            }
        }
    }

    if ( 0 == mprotect( (LPVOID)StartBoundary, MemSize,
                   W32toUnixAccessControl( flNewProtect ) ) )
    {
        /* Reset the access protection. */
        TRACE( "Number of pages to change %d, starting page %d \n",
               NumberOfPagesToChange, OffSet );
        /*
         * Set the old protection flags. We only use the first flag, so
         * if there were several regions with each with different flags only the
         * first region's protection flag will be returned.
         */
        if ( pEntry )
        {
            *lpflOldProtect =
                VIRTUALConvertVirtualFlags( pEntry->pProtectionState[ OffSet ] );

            memset( pEntry->pProtectionState + OffSet,
                    VIRTUALConvertWinFlags( flNewProtect ),
                    NumberOfPagesToChange );
        }
        else
        {
            *lpflOldProtect = PAGE_EXECUTE_READWRITE;
        }
        bRetVal = TRUE;
    }
    else
    {
        ERROR( "%s\n", strerror( errno ) );
        if ( errno == EINVAL )
        {
            SetLastError( ERROR_INVALID_ADDRESS );
        }
        else if ( errno == EACCES )
        {
            SetLastError( ERROR_INVALID_ACCESS );
        }
    }
ExitVirtualProtect:
    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    LOGEXIT( "VirtualProtect returning %s.\n", bRetVal == TRUE ? "TRUE" : "FALSE" );
    PERF_EXIT(VirtualProtect);
    return bRetVal;
}